

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O1

FT_Error cff_builder_add_contour(CFF_Builder *builder)

{
  FT_Outline *pFVar1;
  FT_GlyphLoader loader;
  int iVar2;
  
  pFVar1 = builder->current;
  if (builder->load_points != '\0') {
    loader = builder->loader;
    iVar2 = 0;
    if (loader->max_contours <
        (int)(loader->current).outline.n_contours + (int)(loader->base).outline.n_contours + 1U) {
      iVar2 = FT_GlyphLoader_CheckPoints(loader,0,1);
    }
    if (iVar2 != 0) {
      return iVar2;
    }
    if (0 < pFVar1->n_contours) {
      pFVar1->contours[(int)pFVar1->n_contours - 1] = pFVar1->n_points + -1;
    }
  }
  pFVar1->n_contours = pFVar1->n_contours + 1;
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cff_builder_add_contour( CFF_Builder*  builder )
  {
    FT_Outline*  outline = builder->current;
    FT_Error     error;


    if ( !builder->load_points )
    {
      outline->n_contours++;
      return FT_Err_Ok;
    }

    error = FT_GLYPHLOADER_CHECK_POINTS( builder->loader, 0, 1 );
    if ( !error )
    {
      if ( outline->n_contours > 0 )
        outline->contours[outline->n_contours - 1] =
          (short)( outline->n_points - 1 );

      outline->n_contours++;
    }

    return error;
  }